

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O1

void __thiscall
timertt::details::
timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::heap_remove(timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              *this,timer_type *timer)

{
  pointer *ppptVar1;
  size_t sVar2;
  pointer pptVar3;
  pointer pptVar4;
  timer_type *ptVar5;
  size_t sVar6;
  ulong uVar7;
  timer_type *ptVar8;
  ulong uVar9;
  pointer pptVar10;
  unsigned_long __tmp;
  ulong uVar11;
  ulong uVar12;
  
  sVar2 = timer->m_position;
  pptVar3 = (this->m_heap).
            super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pptVar4 = (this->m_heap).
            super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pptVar10 = pptVar4 + -1;
  if (sVar2 == (long)pptVar4 - (long)pptVar3 >> 3) {
    (this->m_heap).
    super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = pptVar10;
  }
  else {
    ptVar5 = *pptVar10;
    pptVar3[sVar2 - 1] = ptVar5;
    sVar6 = ptVar5->m_position;
    (this->m_heap).
    super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar6 - 1] = timer;
    timer->m_position = sVar6;
    ptVar5->m_position = sVar2;
    ppptVar1 = &(this->m_heap).
                super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + -1;
    while( true ) {
      uVar7 = ptVar5->m_position;
      uVar9 = uVar7 * 2;
      pptVar3 = (this->m_heap).
                super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(this->m_heap).
                     super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pptVar3 >> 3;
      uVar11 = uVar7;
      if ((uVar9 <= uVar12) &&
         ((pptVar3[uVar7 * 2 + -1]->m_when).__d.__r <= (pptVar3[uVar7 - 1]->m_when).__d.__r)) {
        uVar11 = uVar9;
      }
      if ((uVar9 < uVar12) &&
         ((pptVar3[uVar7 * 2]->m_when).__d.__r <= (pptVar3[uVar11 - 1]->m_when).__d.__r)) {
        uVar11 = uVar7 * 2 + 1;
      }
      if (uVar11 == uVar7) break;
      ptVar8 = pptVar3[uVar11 - 1];
      pptVar3[uVar7 - 1] = ptVar8;
      sVar2 = ptVar8->m_position;
      (this->m_heap).
      super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
      ._M_impl.super__Vector_impl_data._M_start[sVar2 - 1] = ptVar5;
      ptVar5->m_position = sVar2;
      ptVar8->m_position = uVar7;
    }
  }
  return;
}

Assistant:

void
	heap_remove( timer_type * timer )
	{
		if( timer->m_position == m_heap.size() )
			// A special case: timer to remove is a last added item
			// in the heap. It could be simply removed from heap
			// without any other actions.
			m_heap.pop_back();
		else
		{
			auto last_item = m_heap.back();
			heap_swap( timer, last_item );
			m_heap.pop_back();

			// last_item must be heap-down to the appropriate place.
			while( true )
			{
				auto left_index = last_item->m_position * 2;
				auto right_index = left_index + 1;
				auto min_index = last_item->m_position;

				if( left_index <= m_heap.size() &&
						heap_item( left_index )->m_when <=
								heap_item( min_index )->m_when )
					min_index = left_index;

				if( right_index <= m_heap.size() &&
						heap_item( right_index )->m_when <=
								heap_item( min_index )->m_when )
					min_index = right_index;

				if( min_index != last_item->m_position )
					heap_swap( last_item, heap_item( min_index ) );
				else
					// Heap structure is correct.
					break;
			}
		}
	}